

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O0

String * __thiscall
asl::SocketServer::socketError(String *__return_storage_ptr__,SocketServer *this)

{
  SocketServer *this_local;
  
  asl::String::String(__return_storage_ptr__,&this->_socketError);
  return __return_storage_ptr__;
}

Assistant:

String SocketServer::socketError() const
{
	return _socketError;
}